

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver)

{
  JavaType JVar1;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *pcVar2;
  allocator local_19;
  
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (__return_storage_ptr__,(ClassNameResolver *)field,descriptor);
  }
  else {
    JVar1 = GetJavaType((FieldDescriptor *)this);
    if (JVar1 == JAVATYPE_ENUM) {
      descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
      ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
                (__return_storage_ptr__,(ClassNameResolver *)field,descriptor_00);
    }
    else {
      JVar1 = GetJavaType((FieldDescriptor *)this);
      pcVar2 = KotlinTypeName(JVar1);
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_19);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KotlinTypeName(const FieldDescriptor* field,
                           ClassNameResolver* name_resolver) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return KotlinTypeName(GetJavaType(field));
  }
}